

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

int __thiscall
TPZSparseBlockDiagonal<long_double>::Put
          (TPZSparseBlockDiagonal<long_double> *this,int64_t row,int64_t col,longdouble *value)

{
  int iVar1;
  int64_t cblockindex;
  int64_t rblockindex;
  int64_t rblock;
  int64_t cblock;
  
  FindBlockIndex(this,row,&rblock,&rblockindex);
  iVar1 = -1;
  if (rblock != -1) {
    FindBlockIndex(this,col,&cblock,&cblockindex);
    if (cblock == rblock) {
      (this->super_TPZBlockDiagonal<long_double>).fStorage.fStore
      [(this->super_TPZBlockDiagonal<long_double>).fBlockPos.fStore[cblock] +
       rblockindex +
       (this->super_TPZBlockDiagonal<long_double>).fBlockSize.fStore[cblock] * cblockindex] = *value
      ;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::Put(const int64_t row, const int64_t col, const TVar& value)
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return -1;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return -1;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	this->fStorage[this->fBlockPos[rblock]+pos] = value;
	return 0;
}